

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathCompOpEvalFilterFirst
              (xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,xmlNodePtr *first)

{
  int iVar1;
  xmlNodePtr local_50;
  xmlNodePtr last;
  xmlNodeSetPtr pxStack_40;
  int f;
  xmlNodeSetPtr set;
  xmlXPathCompExprPtr comp;
  xmlNodePtr *ppxStack_28;
  int total;
  xmlNodePtr *first_local;
  xmlXPathStepOpPtr op_local;
  xmlXPathParserContextPtr ctxt_local;
  
  comp._4_4_ = 0;
  if (ctxt->error == 0) {
    set = (xmlNodeSetPtr)ctxt->comp;
    ppxStack_28 = first;
    first_local = (xmlNodePtr *)op;
    op_local = (xmlXPathStepOpPtr)ctxt;
    if ((((((op->ch1 == -1) || (op->ch2 == -1)) ||
          (((xmlXPathCompExprPtr)set)->steps[op->ch1].op != XPATH_OP_SORT)) ||
         ((((xmlXPathCompExprPtr)set)->steps[op->ch2].op != XPATH_OP_SORT ||
          (last._4_4_ = ((xmlXPathCompExprPtr)set)->steps[op->ch2].ch1, last._4_4_ == -1)))) ||
        ((((xmlXPathCompExprPtr)set)->steps[last._4_4_].op != XPATH_OP_FUNCTION ||
         ((((xmlXPathCompExprPtr)set)->steps[last._4_4_].value5 != (void *)0x0 ||
          (((xmlXPathCompExprPtr)set)->steps[last._4_4_].value != 0)))))) ||
       ((((xmlXPathCompExprPtr)set)->steps[last._4_4_].value4 == (void *)0x0 ||
        (iVar1 = xmlStrEqual((xmlChar *)((xmlXPathCompExprPtr)set)->steps[last._4_4_].value4,
                             (xmlChar *)"last"), iVar1 == 0)))) {
      if (*(int *)((long)first_local + 4) != -1) {
        iVar1 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                                   (xmlXPathStepOpPtr)
                                   (set->nodeTab + (long)*(int *)((long)first_local + 4) * 7));
        comp._4_4_ = iVar1 + comp._4_4_;
      }
      if (op_local->value2 == 0) {
        if (*(int *)(first_local + 1) == -1) {
          ctxt_local._4_4_ = comp._4_4_;
        }
        else if (op_local->value5 == (void *)0x0) {
          ctxt_local._4_4_ = comp._4_4_;
        }
        else if ((op_local->value5 == (void *)0x0) || (*op_local->value5 != 1)) {
          xmlXPathErr((xmlXPathParserContextPtr)op_local,0xb);
          ctxt_local._4_4_ = 0;
        }
        else {
          pxStack_40 = *(xmlNodeSetPtr *)((long)op_local->value5 + 8);
          if ((pxStack_40 != (xmlNodeSetPtr)0x0) &&
             (xmlXPathNodeSetFilter
                        ((xmlXPathParserContextPtr)op_local,pxStack_40,*(int *)(first_local + 1),1,1
                         ,1), 0 < pxStack_40->nodeNr)) {
            *ppxStack_28 = *pxStack_40->nodeTab;
          }
          ctxt_local._4_4_ = comp._4_4_;
        }
      }
      else {
        ctxt_local._4_4_ = 0;
      }
    }
    else {
      local_50 = (xmlNodePtr)0x0;
      iVar1 = xmlXPathCompOpEvalLast
                        ((xmlXPathParserContextPtr)op_local,
                         (xmlXPathStepOpPtr)
                         (set->nodeTab + (long)*(int *)((long)first_local + 4) * 7),&local_50);
      comp._4_4_ = iVar1 + comp._4_4_;
      if (op_local->value2 == 0) {
        if ((((op_local->value5 != (void *)0x0) && (*op_local->value5 == 1)) &&
            (*(long *)((long)op_local->value5 + 8) != 0)) &&
           ((*(long *)(*(long *)((long)op_local->value5 + 8) + 8) != 0 &&
            (1 < **(int **)((long)op_local->value5 + 8))))) {
          xmlXPathNodeSetKeepLast(*(xmlNodeSetPtr *)((long)op_local->value5 + 8));
          *ppxStack_28 = (xmlNodePtr)**(undefined8 **)(*(long *)((long)op_local->value5 + 8) + 8);
        }
        ctxt_local._4_4_ = comp._4_4_;
      }
      else {
        ctxt_local._4_4_ = 0;
      }
    }
  }
  else {
    ctxt_local._4_4_ = 0;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlXPathCompOpEvalFilterFirst(xmlXPathParserContextPtr ctxt,
			      xmlXPathStepOpPtr op, xmlNodePtr * first)
{
    int total = 0;
    xmlXPathCompExprPtr comp;
    xmlNodeSetPtr set;

    CHECK_ERROR0;
    comp = ctxt->comp;
    /*
    * Optimization for ()[last()] selection i.e. the last elem
    */
    if ((op->ch1 != -1) && (op->ch2 != -1) &&
	(comp->steps[op->ch1].op == XPATH_OP_SORT) &&
	(comp->steps[op->ch2].op == XPATH_OP_SORT)) {
	int f = comp->steps[op->ch2].ch1;

	if ((f != -1) &&
	    (comp->steps[f].op == XPATH_OP_FUNCTION) &&
	    (comp->steps[f].value5 == NULL) &&
	    (comp->steps[f].value == 0) &&
	    (comp->steps[f].value4 != NULL) &&
	    (xmlStrEqual
	    (comp->steps[f].value4, BAD_CAST "last"))) {
	    xmlNodePtr last = NULL;

	    total +=
		xmlXPathCompOpEvalLast(ctxt,
		    &comp->steps[op->ch1],
		    &last);
	    CHECK_ERROR0;
	    /*
	    * The nodeset should be in document order,
	    * Keep only the last value
	    */
	    if ((ctxt->value != NULL) &&
		(ctxt->value->type == XPATH_NODESET) &&
		(ctxt->value->nodesetval != NULL) &&
		(ctxt->value->nodesetval->nodeTab != NULL) &&
		(ctxt->value->nodesetval->nodeNr > 1)) {
                xmlXPathNodeSetKeepLast(ctxt->value->nodesetval);
		*first = *(ctxt->value->nodesetval->nodeTab);
	    }
	    return (total);
	}
    }

    if (op->ch1 != -1)
	total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
    CHECK_ERROR0;
    if (op->ch2 == -1)
	return (total);
    if (ctxt->value == NULL)
	return (total);

#ifdef LIBXML_XPTR_LOCS_ENABLED
    /*
    * Hum are we filtering the result of an XPointer expression
    */
    if (ctxt->value->type == XPATH_LOCATIONSET) {
        xmlLocationSetPtr locset = ctxt->value->user;

        if (locset != NULL) {
            xmlXPathLocationSetFilter(ctxt, locset, op->ch2, 1, 1);
            if (locset->locNr > 0)
                *first = (xmlNodePtr) locset->locTab[0]->user;
        }

	return (total);
    }
#endif /* LIBXML_XPTR_LOCS_ENABLED */

    CHECK_TYPE0(XPATH_NODESET);
    set = ctxt->value->nodesetval;
    if (set != NULL) {
        xmlXPathNodeSetFilter(ctxt, set, op->ch2, 1, 1, 1);
        if (set->nodeNr > 0)
            *first = set->nodeTab[0];
    }

    return (total);
}